

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Assimp::FBX::PropertyGet<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,FBX *this,PropertyTable *in,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue)

{
  Property *this_00;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tprop;
  Property *prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue_local;
  string *name_local;
  PropertyTable *in_local;
  
  this_00 = PropertyTable::Get((PropertyTable *)this,(string *)in);
  if (this_00 == (Property *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    this_01 = Property::As<Assimp::FBX::TypedProperty<std::__cxx11::string>>(this_00);
    if (this_01 ==
        (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
    }
    else {
      pbVar1 = TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Value(this_01);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}